

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O2

SQInteger base_print(HSQUIRRELVM v,SQPRINTFUNCTION pf,bool newline)

{
  char *pcVar1;
  SQChar *in_RAX;
  SQRESULT SVar2;
  SQChar *str;
  
  str = in_RAX;
  SVar2 = sq_tostring(v,2);
  if (-1 < SVar2) {
    SVar2 = sq_getstring(v,-1,&str);
    if (pf != (SQPRINTFUNCTION)0x0 && -1 < SVar2) {
      pcVar1 = "can\'t \'++\' or \'--\' %s";
      if (newline) {
        pcVar1 = "Unknown warning ID %s\n";
      }
      (*pf)(v,pcVar1 + 0x13,str);
      return 0;
    }
    if (-1 < SVar2) {
      return 0;
    }
  }
  return -1;
}

Assistant:

static SQInteger base_print(HSQUIRRELVM v, SQPRINTFUNCTION pf, bool newline)
{
    if(SQ_SUCCEEDED(sq_tostring(v,2)))
    {
        const SQChar *str;
        if(SQ_SUCCEEDED(sq_getstring(v,-1,&str))) {
            if(pf)
                pf(v, newline ? _SC("%s\n") : _SC("%s"), str);
            return 0;
        }
    }
    return SQ_ERROR;
}